

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O1

void __thiscall re2c::Skeleton::~Skeleton(Skeleton *this)

{
  Node *pNVar1;
  path_t *ppVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  
  pNVar1 = this->nodes;
  if (pNVar1 != (Node *)0x0) {
    ppVar2 = pNVar1[-1].suffix;
    if (ppVar2 != (path_t *)0x0) {
      lVar5 = (long)ppVar2 * 0xb0;
      do {
        Node::~Node((Node *)(&pNVar1[-1].arcs._M_t._M_impl.field_0x0 + lVar5));
        lVar5 = lVar5 + -0xb0;
      } while (lVar5 != 0);
    }
    operator_delete__(&pNVar1[-1].suffix,(long)ppVar2 * 0xb0 | 8);
  }
  std::
  _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::~_Rb_tree(&(this->rules)._M_t);
  pcVar3 = (this->cond)._M_dataplus._M_p;
  paVar4 = &(this->cond).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  paVar4 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Skeleton::~Skeleton ()
{
	delete [] nodes;
}